

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_cure_light(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_ESI;
  undefined4 in_R8D;
  int heal;
  CHAR_DATA *victim;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = dice(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  iVar1 = iVar1 + in_ESI / 3;
  iVar2 = in_RCX->hit + iVar1;
  piVar3 = std::min<int>((int *)&stack0xffffffffffffffd0,(int *)&stack0xffffffffffffffcc);
  in_RCX->hit = *piVar3;
  update_pos((CHAR_DATA *)CONCAT44(iVar1,iVar2));
  send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
  if (in_RDX != in_RCX) {
    send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
  }
  return;
}

Assistant:

void spell_cure_light(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int heal;

	heal = dice(1, 8) + level / 3;
	victim->hit = std::min(victim->hit + heal, (int)victim->max_hit);

	update_pos(victim);
	send_to_char("You feel better!\n\r", victim);

	if (ch != victim)
		send_to_char("Ok.\n\r", ch);
}